

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O3

string * Uri::Uri::referenceResolution(string *__return_storage_ptr__,string *scheme,string *path)

{
  int iVar1;
  size_type sVar2;
  char *pcVar3;
  
  iVar1 = std::__cxx11::string::compare((char *)scheme);
  if (((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)scheme), iVar1 == 0)) ||
     (iVar1 = std::__cxx11::string::compare((char *)scheme), iVar1 == 0)) {
    sVar2 = path->_M_string_length;
    if (sVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"/","");
      return __return_storage_ptr__;
    }
    pcVar3 = (path->_M_dataplus)._M_p;
    if (*pcVar3 != '/') {
      std::operator+(__return_storage_ptr__,"/",path);
      return __return_storage_ptr__;
    }
  }
  else {
    pcVar3 = (path->_M_dataplus)._M_p;
    sVar2 = path->_M_string_length;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>((string *)__return_storage_ptr__,pcVar3,pcVar3 + sVar2);
  return __return_storage_ptr__;
}

Assistant:

string Uri::referenceResolution (const string &scheme, const string &path) {
    if (scheme == "https" || scheme == "http" || scheme == "file") {
        if (path.empty()) {
            return "/";
        }

        if (path[0] != '/') {
            return "/" + path;
        }
    }

    return path;
}